

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

Own<capnp::EzRpcServer::Impl> __thiscall
kj::
heap<capnp::EzRpcServer::Impl,capnp::Capability::Client,kj::StringPtr&,unsigned_int&,capnp::ReaderOptions&>
          (kj *this,Client *params,StringPtr *params_1,uint *params_2,ReaderOptions *params_3)

{
  ClientHook *pCVar1;
  Impl *pIVar2;
  Impl *extraout_RDX;
  Impl *extraout_RDX_00;
  Own<capnp::EzRpcServer::Impl> OVar3;
  Client local_40;
  
  pIVar2 = (Impl *)operator_new(0x98);
  local_40.hook.disposer = (params->hook).disposer;
  local_40.hook.ptr = (params->hook).ptr;
  (params->hook).ptr = (ClientHook *)0x0;
  capnp::EzRpcServer::Impl::Impl(pIVar2,&local_40,(StringPtr)params_1->content,*params_2,*params_3);
  pCVar1 = local_40.hook.ptr;
  *(undefined8 **)this = &_::HeapDisposer<capnp::EzRpcServer::Impl>::instance;
  *(Impl **)(this + 8) = pIVar2;
  pIVar2 = extraout_RDX;
  if (local_40.hook.ptr != (ClientHook *)0x0) {
    local_40.hook.ptr = (ClientHook *)0x0;
    (**(local_40.hook.disposer)->_vptr_Disposer)
              (local_40.hook.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook
              );
    pIVar2 = extraout_RDX_00;
  }
  OVar3.ptr = pIVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}